

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcPartialsPartialsFixedScaling
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,float *scaleFactors,int startPattern,int endPattern)

{
  float *pfVar1;
  float fVar2;
  undefined4 uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  
  lVar17 = (long)(this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
  if (0 < lVar17) {
    iVar4 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
    iVar18 = startPattern * 4;
    lVar20 = 0;
    auVar5 = vpmovsxbq_avx(ZEXT216(0xa05));
    auVar6 = vpmovsxbq_avx2(ZEXT416(0x100b0601));
    auVar7 = vpmovsxbq_avx2(ZEXT416(0x110c0702));
    auVar8 = vpmovsxbq_avx2(ZEXT416(0x120d0803));
    do {
      if (startPattern < endPattern) {
        pfVar1 = destP + iVar18;
        auVar32 = vpbroadcastq_avx512vl();
        auVar22 = vpaddq_avx(auVar32._0_16_,auVar5);
        lVar21 = lVar20 * 0x14 + 0xf;
        auVar9 = vpermq_avx2(ZEXT1632(auVar22),0xd0);
        auVar9 = vpblendd_avx2(auVar9,auVar32,3);
        auVar33 = vpbroadcastq_avx512vl();
        vpblendd_avx2(auVar9,auVar33,0xc0);
        auVar22 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + (long)matrices2));
        vpaddq_avx2(auVar32,auVar6);
        auVar23 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + (long)pfVar1));
        vpaddq_avx2(auVar32,auVar7);
        auVar24 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + lVar21));
        vpaddq_avx2(auVar32,auVar8);
        auVar25 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + lVar20));
        auVar26 = vgatherqps_avx512vl(*(undefined8 *)((long)matrices2 * 5));
        auVar27 = vgatherqps_avx512vl(*(undefined8 *)(matrices2 + (long)pfVar1));
        auVar28 = vgatherqps_avx512vl(*(undefined8 *)(matrices2 + lVar21));
        auVar29 = vgatherqps_avx512vl(*(undefined8 *)(matrices2 + lVar20));
        lVar19 = 0;
        lVar21 = (long)endPattern - (long)startPattern;
        do {
          fVar2 = partials1[(long)iVar18 + lVar19 + 1];
          auVar30._4_4_ = fVar2;
          auVar30._0_4_ = fVar2;
          auVar30._8_4_ = fVar2;
          auVar30._12_4_ = fVar2;
          auVar30 = vmulps_avx512vl(auVar23,auVar30);
          fVar2 = partials1[iVar18 + lVar19];
          auVar31._4_4_ = fVar2;
          auVar31._0_4_ = fVar2;
          auVar31._8_4_ = fVar2;
          auVar31._12_4_ = fVar2;
          auVar30 = vfmadd231ps_avx512vl(auVar30,auVar22,auVar31);
          fVar2 = partials1[(long)iVar18 + lVar19 + 2];
          auVar10._4_4_ = fVar2;
          auVar10._0_4_ = fVar2;
          auVar10._8_4_ = fVar2;
          auVar10._12_4_ = fVar2;
          auVar30 = vfmadd231ps_avx512vl(auVar30,auVar24,auVar10);
          fVar2 = partials1[(long)iVar18 + lVar19 + 3];
          auVar11._4_4_ = fVar2;
          auVar11._0_4_ = fVar2;
          auVar11._8_4_ = fVar2;
          auVar11._12_4_ = fVar2;
          auVar30 = vfmadd231ps_avx512vl(auVar30,auVar25,auVar11);
          fVar2 = partials2[(long)iVar18 + lVar19 + 1];
          auVar12._4_4_ = fVar2;
          auVar12._0_4_ = fVar2;
          auVar12._8_4_ = fVar2;
          auVar12._12_4_ = fVar2;
          auVar31 = vmulps_avx512vl(auVar27,auVar12);
          fVar2 = partials2[iVar18 + lVar19];
          auVar13._4_4_ = fVar2;
          auVar13._0_4_ = fVar2;
          auVar13._8_4_ = fVar2;
          auVar13._12_4_ = fVar2;
          auVar31 = vfmadd231ps_avx512vl(auVar31,auVar26,auVar13);
          fVar2 = partials2[(long)iVar18 + lVar19 + 2];
          auVar14._4_4_ = fVar2;
          auVar14._0_4_ = fVar2;
          auVar14._8_4_ = fVar2;
          auVar14._12_4_ = fVar2;
          auVar31 = vfmadd231ps_avx512vl(auVar31,auVar28,auVar14);
          fVar2 = partials2[(long)iVar18 + lVar19 + 3];
          auVar15._4_4_ = fVar2;
          auVar15._0_4_ = fVar2;
          auVar15._8_4_ = fVar2;
          auVar15._12_4_ = fVar2;
          auVar31 = vfmadd231ps_avx512vl(auVar31,auVar29,auVar15);
          auVar34._0_4_ = auVar30._0_4_ * auVar31._0_4_;
          auVar34._4_4_ = auVar30._4_4_ * auVar31._4_4_;
          auVar34._8_4_ = auVar30._8_4_ * auVar31._8_4_;
          auVar34._12_4_ = auVar30._12_4_ * auVar31._12_4_;
          uVar3 = *(undefined4 *)((long)scaleFactors + lVar19 + (long)startPattern * 4);
          auVar16._4_4_ = uVar3;
          auVar16._0_4_ = uVar3;
          auVar16._8_4_ = uVar3;
          auVar16._12_4_ = uVar3;
          auVar30 = vdivps_avx512vl(auVar34,auVar16);
          *(undefined1 (*) [16])(pfVar1 + lVar19) = auVar30;
          lVar19 = lVar19 + 4;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
      }
      lVar20 = lVar20 + 1;
      iVar18 = iVar18 + iVar4 * 4;
    } while (lVar20 != lVar17);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsFixedScaling(REALTYPE* destP,
                                                                               const REALTYPE* partials1,
                                                                               const REALTYPE* matrices1,
                                                                               const REALTYPE* partials2,
                                                                               const REALTYPE* matrices2,
                                                                               const REALTYPE* scaleFactors,
                                                                               int startPattern,
                                                                               int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }

        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);

        for (int k = startPattern; k < endPattern; k++) {

            // Prefetch scale factor
            const REALTYPE scaleFactor = scaleFactors[k];

            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20 / scaleFactor;
            destP[u + 1] = sum11 * sum21 / scaleFactor;
            destP[u + 2] = sum12 * sum22 / scaleFactor;
            destP[u + 3] = sum13 * sum23 / scaleFactor;

            u += 4;
        }
    }
}